

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O1

void __thiscall
Memory::RecyclerSweep::
TransferPendingEmptyHeapBlocks<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  uint32 *puVar1;
  HeapBlockList *this_00;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail_00;
  code *pcVar2;
  bool bVar3;
  uint in_EAX;
  uint uVar4;
  undefined4 *puVar5;
  uint32 *in_R8;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  anon_class_16_2_f79d628a fn;
  undefined1 auStack_38 [12];
  uint32 count;
  
  auStack_38._0_4_ = in_EAX;
  bVar3 = IsBackground(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbe,"(!this->IsBackground())","!this->IsBackground()");
    if (!bVar3) goto LAB_006c377b;
    *puVar5 = 0;
  }
  bVar3 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
          IsAllocationStopped(heapBucket);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbf,"(!heapBucket->IsAllocationStopped())",
                       "!heapBucket->IsAllocationStopped()");
    if (!bVar3) goto LAB_006c377b;
    *puVar5 = 0;
  }
  SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  ::GetNonEmptyHeapBlockCount
            ((SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *)heapBucket,true);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  GetEmptyHeapBlockCount(heapBucket);
  uVar4 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
  if ((this->withBarrierData).bucketData[uVar4].pendingSweepList !=
      (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xc3,"(bucketData.pendingSweepList == nullptr)",
                       "bucketData.pendingSweepList == nullptr");
    if (!bVar3) goto LAB_006c377b;
    *puVar5 = 0;
  }
  this_00 = (HeapBlockList *)(this->withBarrierData).bucketData[uVar4].pendingEmptyBlockList;
  tail_00 = (this->withBarrierData).bucketData[uVar4].pendingEmptyBlockListTail;
  if (this_00 == (HeapBlockList *)0x0) {
    if (tail_00 != (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xe2,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                         "bucketData.pendingEmptyBlockListTail == nullptr");
      if (!bVar3) {
LAB_006c377b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    auStack_38._4_4_ = 0;
    fn.count = in_R8;
    fn.tail = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)(auStack_38 + 4);
    HeapBlockList::
    ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::RecyclerSweep::TransferPendingEmptyHeapBlocks<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
              (this_00,(SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
               tail_00,fn);
    puVar1 = &(heapBucket->super_HeapBucket).emptyHeapBlockCount;
    *puVar1 = *puVar1 + auStack_38._4_4_;
    puVar1 = &(heapBucket->super_HeapBucket).heapBlockCount;
    *puVar1 = *puVar1 - auStack_38._4_4_;
    (tail_00->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next =
         (SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBucket->emptyBlockList;
    heapBucket->emptyBlockList =
         (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)this_00;
    (this->withBarrierData).bucketData[uVar4].pendingEmptyBlockList =
         (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
    ::GetNonEmptyHeapBlockCount
              ((SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)heapBucket,true);
    HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
    GetEmptyHeapBlockCount(heapBucket);
  }
  return;
}

Assistant:

void
RecyclerSweep::TransferPendingEmptyHeapBlocks(HeapBucketT<TBlockType> * heapBucket)
{
    Assert(!this->IsBackground());
    Assert(!heapBucket->IsAllocationStopped());
    RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));

    auto& bucketData = this->GetBucketData(heapBucket);
    Assert(bucketData.pendingSweepList == nullptr);
    TBlockType * list = bucketData.pendingEmptyBlockList;
    if (list)
    {
        TBlockType * tail = bucketData.pendingEmptyBlockListTail;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        uint32 count = 0;
        HeapBlockList::ForEach(list, [tail, &count](TBlockType * heapBlock)
        {
            Assert(heapBlock->GetAddress() == nullptr);
            Assert(heapBlock->GetSegment() == nullptr);
            Assert(heapBlock->GetNextBlock() != nullptr || heapBlock == tail);
            count++;
        });
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        heapBucket->emptyHeapBlockCount += count;
#endif
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        heapBucket->heapBlockCount -= count;
#endif
#endif


        tail->SetNextBlock(heapBucket->emptyBlockList);
        heapBucket->emptyBlockList = list;

        bucketData.pendingEmptyBlockList = nullptr;
        RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));
    }
    else
    {
        Assert(bucketData.pendingEmptyBlockListTail == nullptr);
    }
}